

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

bool __thiscall capnp::DynamicStruct::Reader::isSetInUnion(Reader *this,Field field)

{
  bool bVar1;
  unsigned_short uVar2;
  uint16_t uVar3;
  uint32_t offset;
  StructDataOffset offset_00;
  Reader local_b0;
  Reader local_80;
  unsigned_short local_4a;
  undefined1 local_48 [6];
  uint16_t discrim;
  Reader proto;
  Reader *this_local;
  
  proto._reader._40_8_ = this;
  StructSchema::Field::getProto((Reader *)local_48,&field);
  bVar1 = anon_unknown_70::hasDiscriminantValue((Reader *)local_48);
  if (bVar1) {
    Schema::getProto(&local_b0,(Schema *)this);
    capnp::schema::Node::Reader::getStruct(&local_80,&local_b0);
    offset = capnp::schema::Node::Struct::Reader::getDiscriminantOffset(&local_80);
    offset_00 = assumeDataOffset(offset);
    uVar2 = capnp::_::StructReader::getDataField<unsigned_short>(&this->reader,offset_00);
    local_4a = uVar2;
    uVar3 = capnp::schema::Field::Reader::getDiscriminantValue((Reader *)local_48);
    this_local._7_1_ = uVar2 == uVar3;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DynamicStruct::Reader::isSetInUnion(StructSchema::Field field) const {
  auto proto = field.getProto();
  if (hasDiscriminantValue(proto)) {
    uint16_t discrim = reader.getDataField<uint16_t>(
        assumeDataOffset(schema.getProto().getStruct().getDiscriminantOffset()));
    return discrim == proto.getDiscriminantValue();
  } else {
    return true;
  }
}